

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void rw::verifyMesh(Geometry *geo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__s;
  Triangle *pTVar5;
  uint8 *seen;
  Triangle *t;
  Mesh *mesh;
  int32 m;
  int32 c;
  int32 b;
  int32 a;
  int32 x;
  uint32 j;
  int32 k;
  int32 i;
  Geometry *geo_local;
  
  __s = mustmalloc_LOC((long)geo->numTriangles,0x1000f,
                       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/tristrip.cpp line: 632"
                      );
  memset(__s,0,(long)geo->numTriangles);
  t = (Triangle *)MeshHeader::getMeshes(geo->meshHeader);
  j = 0;
  do {
    if ((int)(uint)geo->meshHeader->numMeshes <= (int)j) {
      j = 0;
      while( true ) {
        if (geo->numTriangles <= (int)j) {
          (*DAT_00168638)(__s);
          return;
        }
        if (*(char *)((long)__s + (long)(int)j) == '\0') break;
        j = j + 1;
      }
LAB_001199d3:
      fprintf(_stderr,"TRISTRIP verify failed\n");
      exit(1);
    }
    uVar1 = MaterialList::findIndex(&geo->matList,(Material *)t[2]);
    b = 0;
    for (a = 0; (uint)a < *(int *)t[1].v - 2U; a = a + 1) {
      uVar2 = (uint)*(ushort *)((long)*t + (ulong)(uint)(a + b) * 2);
      b = (int32)((b != 0 ^ 0xffU) & 1);
      uVar3 = (uint)*(ushort *)((long)*t + (ulong)(uint)(a + b) * 2);
      uVar4 = (uint)*(ushort *)((long)*t + (ulong)(a + 2) * 2);
      if (((geo->numVertices <= (int)uVar2) || (geo->numVertices <= (int)uVar3)) ||
         (geo->numVertices <= (int)uVar4)) {
        fprintf(_stderr,"triangle %d %d %d out of range (%d)\n",(ulong)uVar2,(ulong)uVar3,
                (ulong)uVar4,(ulong)(uint)geo->numVertices);
        goto LAB_001199d3;
      }
      if (((uVar2 != uVar3) && (uVar2 != uVar4)) && (uVar3 != uVar4)) {
        x = 0;
        while( true ) {
          if (geo->numTriangles <= x) goto LAB_001199d3;
          pTVar5 = geo->triangles + x;
          if (((*(char *)((long)__s + (long)x) == '\0') && (pTVar5->matId == uVar1)) &&
             ((((pTVar5->v[0] == uVar2 && ((pTVar5->v[1] == uVar3 && (pTVar5->v[2] == uVar4)))) ||
               ((pTVar5->v[1] == uVar2 && ((pTVar5->v[2] == uVar3 && (pTVar5->v[0] == uVar4)))))) ||
              ((pTVar5->v[2] == uVar2 && ((pTVar5->v[0] == uVar3 && (pTVar5->v[1] == uVar4))))))))
          break;
          x = x + 1;
        }
        *(undefined1 *)((long)__s + (long)x) = 1;
      }
    }
    t = t + 3;
    j = j + 1;
  } while( true );
}

Assistant:

static void
verifyMesh(Geometry *geo)
{
	int32 i, k;
	uint32 j;
	int32 x;
	int32 a, b, c, m;
	Mesh *mesh;
	Triangle *t;
	uint8 *seen;

	seen = rwNewT(uint8, geo->numTriangles, MEMDUR_FUNCTION | ID_GEOMETRY);
	memset(seen, 0, geo->numTriangles);

	mesh = geo->meshHeader->getMeshes();
	for(i = 0; i < geo->meshHeader->numMeshes; i++){
		m = geo->matList.findIndex(mesh->material);
		x = 0;
		for(j = 0; j < mesh->numIndices-2; j++){
			a = mesh->indices[j+x];
			x = !x;
			b = mesh->indices[j+x];
			c = mesh->indices[j+2];
			if(a >= geo->numVertices ||
			   b >= geo->numVertices ||
			   c >= geo->numVertices){
				fprintf(stderr, "triangle %d %d %d out of range (%d)\n", a, b, c, geo->numVertices);
				goto loss;
			}
			if(a == b || a == c || b == c)
				continue;
trace("%d %d %d\n", a, b, c);

			/* now that we have a triangle, try to find it */
			for(k = 0; k < geo->numTriangles; k++){
				t = &geo->triangles[k];
				if(seen[k] || t->matId != m) continue;
				if((t->v[0] == a && t->v[1] == b && t->v[2] == c) ||
				   (t->v[1] == a && t->v[2] == b && t->v[0] == c) ||
				   (t->v[2] == a && t->v[0] == b && t->v[1] == c)){
					seen[k] = 1;
					goto found;
				}
			}
			goto loss;
		found:	;
		}
		mesh++;
	}

	/* Also check that all triangles are in the mesh */
	for(i = 0; i < geo->numTriangles; i++)
		if(!seen[i]){
	loss:
			fprintf(stderr, "TRISTRIP verify failed\n");
			exit(1);
		}

	rwFree(seen);
}